

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_partitioned_hashtable.cpp
# Opt level: O1

void __thiscall
duckdb::RadixHTLocalSourceState::ExecuteTask
          (RadixHTLocalSourceState *this,RadixHTGlobalSinkState *sink,
          RadixHTGlobalSourceState *gstate,DataChunk *chunk)

{
  InternalException *this_00;
  string local_40;
  
  if (this->task == SCAN) {
    Scan(this,sink,gstate,chunk);
    return;
  }
  if (this->task == FINALIZE) {
    Finalize(this,sink,gstate);
    return;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Unexpected RadixHTSourceTaskType in ExecuteTask!","");
  InternalException::InternalException(this_00,&local_40);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void RadixHTLocalSourceState::ExecuteTask(RadixHTGlobalSinkState &sink, RadixHTGlobalSourceState &gstate,
                                          DataChunk &chunk) {
	D_ASSERT(task != RadixHTSourceTaskType::NO_TASK);
	switch (task) {
	case RadixHTSourceTaskType::FINALIZE:
		Finalize(sink, gstate);
		break;
	case RadixHTSourceTaskType::SCAN:
		Scan(sink, gstate, chunk);
		break;
	default:
		throw InternalException("Unexpected RadixHTSourceTaskType in ExecuteTask!");
	}
}